

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es32cRobustBufferAccessBehaviorTests.cpp
# Opt level: O3

bool __thiscall
es32cts::RobustBufferAccessBehavior::TexelFetchTest::verifyValidResults
          (TexelFetchTest *this,GLuint texture_id)

{
  GLuint i;
  int iVar1;
  GLenum GVar2;
  undefined4 extraout_var;
  pointer puVar3;
  float *pfVar4;
  uint *puVar5;
  long lVar6;
  ulong uVar7;
  pointer puVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  vector<unsigned_int,_std::allocator<unsigned_int>_> pixels_2;
  Texture destination_texture;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pixels;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  undefined1 local_1b0 [8];
  undefined1 local_1a8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [6];
  ios_base local_138 [264];
  Functions *gl;
  
  pixels_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       pixels_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  iVar1 = (*((this->super_TexelFetchTest).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar1);
  switch((this->super_TexelFetchTest).m_test_case) {
  case R8:
    deqp::RobustBufferAccessBehavior::Texture::Bind(gl,texture_id,0xde1);
    pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._0_16_ = ZEXT816(0);
    pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&pixels,0x400);
    lVar6 = 0;
    do {
      pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[lVar6] = (uchar)lVar6;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x100);
    deqp::RobustBufferAccessBehavior::Texture::GetData
              (gl,texture_id,0,0x10,0x10,0x1908,0x1401,
               pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start);
    deqp::RobustBufferAccessBehavior::Texture::Bind(gl,0,0xde1);
    uVar10 = 0;
    if (*pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start == '\0') {
      do {
        uVar9 = uVar10;
        if (uVar9 == 0xff) goto LAB_00ca6060;
        uVar10 = uVar9 + 1;
      } while (uVar9 + 1 ==
               (ulong)pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar9 * 4 + 4]);
      bVar11 = 0xfe < uVar9;
    }
    else {
      bVar11 = false;
    }
    local_1b0 = (undefined1  [8])
                ((this->super_TexelFetchTest).super_TestCase.m_context)->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Invalid value: ",0xf);
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,". Expected value: ",0x12);
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," at offset: ",0xc);
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    break;
  case RG8_SNORM:
    deqp::RobustBufferAccessBehavior::Texture::Bind(gl,texture_id,0xde1);
    pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._0_16_ = ZEXT816(0);
    pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&pixels,0x400);
    lVar6 = 0;
    do {
      pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[lVar6 * 4] = (uchar)lVar6;
      pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[lVar6 * 4 + 1] = (uchar)lVar6;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x100);
    deqp::RobustBufferAccessBehavior::Texture::GetData
              (gl,texture_id,0,0x10,0x10,0x1908,0x1400,
               pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start);
    uVar13 = 0;
    deqp::RobustBufferAccessBehavior::Texture::Bind(gl,0,0xde1);
    uVar12 = (uint)(char)*pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start;
    if (*pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start == '\0' &&
        pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start[1] == '\0') {
      uVar10 = 1;
      do {
        uVar9 = uVar10;
        if (uVar9 == 0x100) goto LAB_00ca6060;
        uVar13 = (uint)uVar9 & 0xf;
        uVar15 = (uint)(uVar9 >> 4) & 0xfffffff;
        uVar12 = (uint)(char)pixels.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar9 * 4];
        uVar14 = (uint)(char)pixels.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar9 * 4 + 1];
      } while ((uVar13 == uVar12) && (uVar10 = uVar9 + 1, uVar15 == uVar14));
      bVar11 = 0xfe < uVar9 - 1;
    }
    else {
      uVar14 = (uint)(char)pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_start[1];
      bVar11 = false;
      uVar15 = 0;
    }
    local_1b0 = (undefined1  [8])
                ((this->super_TexelFetchTest).super_TestCase.m_context)->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Invalid value: ",0xf);
    std::ostream::operator<<((ostream *)local_1a8,uVar12);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
    std::ostream::operator<<((ostream *)local_1a8,uVar14);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,". Expected value: ",0x12);
    std::ostream::operator<<((ostream *)local_1a8,uVar13);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
    std::ostream::operator<<((ostream *)local_1a8,uVar15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,". At offset: ",0xd);
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    break;
  case R32UI_MULTISAMPLE:
    deqp::RobustBufferAccessBehavior::Program::Program
              ((Program *)&pixels,(this->super_TexelFetchTest).super_TestCase.m_context);
    deqp::RobustBufferAccessBehavior::Texture::Texture
              (&destination_texture,(this->super_TexelFetchTest).super_TestCase.m_context);
    deqp::RobustBufferAccessBehavior::Texture::Generate(gl,&destination_texture.m_id);
    deqp::RobustBufferAccessBehavior::Texture::Bind(gl,destination_texture.m_id,0xde1);
    deqp::RobustBufferAccessBehavior::Texture::Storage(gl,0xde1,1,0x8236,0x10,0x10,0);
    local_1b0 = (undefined1  [8])(local_1a8 + 8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,
               "#version 320 es\n\nlayout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n\nlayout (binding = 1, r32ui) writeonly uniform lowp uimage2D   uni_destination_image;\nlayout (binding = 0, r32ui) readonly  uniform lowp uimage2DMS uni_source_image;\n\nvoid main()\n{\n    ivec2 point = ivec2(gl_WorkGroupID.x, gl_WorkGroupID.y);\n    uint  index = gl_WorkGroupID.y * 16U + gl_WorkGroupID.x;\n\n    uvec4 color_0 = imageLoad(uni_source_image, point, 0);\n    uvec4 color_1 = imageLoad(uni_source_image, point, 1);\n    uvec4 color_2 = imageLoad(uni_source_image, point, 2);\n    uvec4 color_3 = imageLoad(uni_source_image, point, 3);\n\n    if (any(equal(uvec4(color_0.r, color_1.r, color_2.r, color_3.r), uvec4(index + 3U))))\n    {\n        imageStore(uni_destination_image, point, uvec4(1U));\n    }\n    else\n    {\n        imageStore(uni_destination_image, point, uvec4(0U));\n    }\n}\n\n"
               ,"");
    pixels_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)&pixels_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
    std::__cxx11::string::_M_construct<char_const*>((string *)&pixels_2,0x1af8059);
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,0x1af8059);
    local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,0x1af8059);
    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,0x1af8059);
    local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,0x1af8059);
    deqp::RobustBufferAccessBehavior::Program::Init
              ((Program *)&pixels,(string *)local_1b0,(string *)&pixels_2,&local_210,&local_230,
               &local_1f0,&local_1d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    if ((pointer *)
        pixels_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start !=
        &pixels_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage) {
      operator_delete(pixels_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)pixels_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
    }
    if (local_1b0 != (undefined1  [8])(local_1a8 + 8)) {
      operator_delete((void *)local_1b0,local_1a0[0]._M_allocated_capacity + 1);
    }
    deqp::RobustBufferAccessBehavior::Program::Use((Program *)&pixels);
    (*gl->bindImageTexture)(0,texture_id,0,'\0',0,35000,0x8236);
    GVar2 = (*gl->getError)();
    glu::checkError(GVar2,"BindImageTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles32/es32cRobustBufferAccessBehaviorTests.cpp"
                    ,0x2be);
    (*gl->bindImageTexture)(1,destination_texture.m_id,0,'\0',0,0x88b9,0x8236);
    GVar2 = (*gl->getError)();
    glu::checkError(GVar2,"BindImageTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles32/es32cRobustBufferAccessBehaviorTests.cpp"
                    ,0x2c1);
    (*gl->dispatchCompute)(0x10,0x10,1);
    GVar2 = (*gl->getError)();
    glu::checkError(GVar2,"DispatchCompute",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles32/es32cRobustBufferAccessBehaviorTests.cpp"
                    ,0x2c4);
    pixels_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    pixels_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    pixels_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&pixels_2,0x400);
    uVar12 = 0;
    uVar13 = 1;
    uVar14 = 2;
    uVar15 = 3;
    lVar6 = 0;
    do {
      puVar3 = pixels_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start + lVar6;
      *puVar3 = uVar12;
      puVar3[1] = uVar13;
      puVar3[2] = uVar14;
      puVar3[3] = uVar15;
      lVar6 = lVar6 + 4;
      uVar12 = uVar12 + 4;
      uVar13 = uVar13 + 4;
      uVar14 = uVar14 + 4;
      uVar15 = uVar15 + 4;
    } while (lVar6 != 0x400);
    deqp::RobustBufferAccessBehavior::Texture::GetData
              (gl,destination_texture.m_id,0,0x10,0x10,0x8d99,0x1405,
               pixels_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start);
    deqp::RobustBufferAccessBehavior::Texture::Bind(gl,0,0xde1);
    if (*pixels_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start == 1) {
      uVar10 = 0xffffffffffffffff;
      puVar3 = pixels_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        puVar3 = puVar3 + 4;
        if (uVar10 == 0xfe) {
          bVar11 = true;
          goto LAB_00ca656b;
        }
        uVar10 = uVar10 + 1;
      } while (*puVar3 == 1);
      bVar11 = 0xfe < uVar10;
    }
    else {
      bVar11 = false;
    }
    local_1b0 = (undefined1  [8])
                ((this->super_TexelFetchTest).super_TestCase.m_context)->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Invalid value: ",0xf);
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,". Expected value: ",0x12);
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," at offset: ",0xc);
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    if (pixels_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
LAB_00ca656b:
      operator_delete(pixels_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)pixels_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)pixels_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    deqp::RobustBufferAccessBehavior::Texture::~Texture(&destination_texture);
    deqp::RobustBufferAccessBehavior::Program::~Program((Program *)&pixels);
    return bVar11;
  case RGBA32F:
    deqp::RobustBufferAccessBehavior::Texture::Bind(gl,texture_id,0xde1);
    pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<float,_std::allocator<float>_>::resize
              ((vector<float,_std::allocator<float>_> *)&pixels,0x400);
    uVar12 = 0;
    uVar13 = 1;
    uVar14 = 2;
    uVar15 = 3;
    lVar6 = 0;
    do {
      fVar19 = (((float)(uVar12 >> 0x10 | 0x53000000) - 5.497642e+11) +
               (float)(uVar12 & 0xffff | 0x4b000000)) * 0.00390625;
      fVar20 = (((float)(uVar13 >> 0x10 | 0x53000000) - 5.497642e+11) +
               (float)(uVar13 & 0xffff | 0x4b000000)) * 0.00390625;
      fVar21 = (((float)(uVar14 >> 0x10 | 0x53000000) - 5.497642e+11) +
               (float)(uVar14 & 0xffff | 0x4b000000)) * 0.00390625;
      fVar22 = (((float)(uVar15 >> 0x10 | 0x53000000) - 5.497642e+11) +
               (float)(uVar15 & 0xffff | 0x4b000000)) * 0.00390625;
      pfVar4 = (float *)(pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar6 + 0x30);
      *pfVar4 = fVar22;
      pfVar4[1] = fVar22;
      pfVar4[2] = fVar22;
      pfVar4[3] = fVar22;
      pfVar4 = (float *)(pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar6 + 0x20);
      *pfVar4 = fVar21;
      pfVar4[1] = fVar21;
      pfVar4[2] = fVar21;
      pfVar4[3] = fVar21;
      pfVar4 = (float *)(pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar6 + 0x10);
      *pfVar4 = fVar20;
      pfVar4[1] = fVar20;
      pfVar4[2] = fVar20;
      pfVar4[3] = fVar20;
      pfVar4 = (float *)(pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar6);
      *pfVar4 = fVar19;
      pfVar4[1] = fVar19;
      pfVar4[2] = fVar19;
      pfVar4[3] = fVar19;
      uVar12 = uVar12 + 4;
      uVar13 = uVar13 + 4;
      uVar14 = uVar14 + 4;
      uVar15 = uVar15 + 4;
      lVar6 = lVar6 + 0x40;
    } while (lVar6 != 0x1000);
    deqp::RobustBufferAccessBehavior::Texture::GetData
              (gl,texture_id,0,0x10,0x10,0x1908,0x1406,
               pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start);
    deqp::RobustBufferAccessBehavior::Texture::Bind(gl,0,0xde1);
    pfVar4 = (float *)(pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start + 0xc);
    uVar10 = 0;
    bVar11 = false;
    do {
      fVar18 = (float)((uint)uVar10 & 0xf) * 0.0625;
      fVar17 = (float)((uint)(uVar10 >> 4) & 0xfffffff) * 0.0625;
      fVar16 = (float)(int)(uint)uVar10 * 0.00390625;
      fVar19 = pfVar4[-3];
      fVar20 = pfVar4[-2];
      fVar21 = pfVar4[-1];
      fVar22 = *pfVar4;
      if (((((fVar18 != fVar19) || (NAN(fVar18) || NAN(fVar19))) || (fVar17 != fVar20)) ||
          ((NAN(fVar17) || NAN(fVar20) || (fVar16 != fVar21)))) ||
         ((NAN(fVar16) || NAN(fVar21) || ((fVar22 != 1.0 || (NAN(fVar22))))))) {
        local_1b0 = (undefined1  [8])
                    ((this->super_TexelFetchTest).super_TestCase.m_context)->m_testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Invalid value: ",0xf);
        std::ostream::_M_insert<double>((double)fVar19);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
        std::ostream::_M_insert<double>((double)fVar20);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
        std::ostream::_M_insert<double>((double)fVar21);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
        std::ostream::_M_insert<double>((double)fVar22);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,". Expected value: ",0x12);
        std::ostream::_M_insert<double>((double)fVar18);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
        std::ostream::_M_insert<double>((double)fVar17);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
        std::ostream::_M_insert<double>((double)fVar16);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
        std::ostream::_M_insert<double>(1.0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,". At offset: ",0xd)
        ;
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        goto LAB_00ca663a;
      }
      bVar11 = 0xfe < uVar10;
      uVar10 = uVar10 + 1;
      pfVar4 = pfVar4 + 4;
    } while (uVar10 != 0x100);
LAB_00ca6060:
    bVar11 = true;
    puVar8 = pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    goto LAB_00ca6656;
  case R32UI_MIPMAP:
    deqp::RobustBufferAccessBehavior::Texture::Bind(gl,texture_id,0xde1);
    pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._0_16_ = ZEXT816(0);
    pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&pixels,0x400);
    puVar8 = pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    memset(pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start,0,0x1000);
    deqp::RobustBufferAccessBehavior::Texture::GetData
              (gl,texture_id,1,0x10,0x10,0x8d99,0x1405,puVar8);
    deqp::RobustBufferAccessBehavior::Texture::Bind(gl,0,0xde1);
    if (*(int *)pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start == 0) {
      uVar10 = 0xffffffffffffffff;
      puVar5 = (uint *)pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start;
      do {
        puVar5 = puVar5 + 4;
        if (uVar10 == 0xfe) goto LAB_00ca6060;
        uVar9 = uVar10 + 1;
        uVar7 = uVar10 + 2;
        uVar10 = uVar9;
      } while (uVar7 == *puVar5);
      bVar11 = 0xfe < uVar9;
    }
    else {
      bVar11 = false;
    }
    local_1b0 = (undefined1  [8])
                ((this->super_TexelFetchTest).super_TestCase.m_context)->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Invalid value: ",0xf);
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,". Expected value: ",0x12);
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," at offset: ",0xc);
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    break;
  default:
    return true;
  }
LAB_00ca663a:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  puVar8 = pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
LAB_00ca6656:
    operator_delete(puVar8,(long)pixels.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar8);
  }
  return bVar11;
}

Assistant:

bool TexelFetchTest::verifyValidResults(glw::GLuint texture_id)
{
	static const GLuint height   = 16;
	static const GLuint width	= 16;
	static const GLuint n_pixels = height * width;

	const Functions& gl = m_context.getRenderContext().getFunctions();

	bool result = true;

	if (R8 == m_test_case)
	{
		static const GLuint n_channels = 4;

		Texture::Bind(gl, texture_id, GL_TEXTURE_2D);

		std::vector<GLubyte> pixels;
		pixels.resize(n_pixels * n_channels);
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			pixels[i] = (GLubyte)i;
		}

		Texture::GetData(gl, texture_id, 0 /* level */, width, height, GL_RGBA, GL_UNSIGNED_BYTE, &pixels[0]);

		/* Unbind */
		Texture::Bind(gl, 0, GL_TEXTURE_2D);

		/* Verify */
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			const GLubyte expected_red = (GLubyte)i;
			const GLubyte drawn_red	= pixels[i * n_channels];

			if (expected_red != drawn_red)
			{
				m_context.getTestContext().getLog() << tcu::TestLog::Message << "Invalid value: " << (GLuint)drawn_red
													<< ". Expected value: " << (GLuint)expected_red
													<< " at offset: " << i << tcu::TestLog::EndMessage;

				result = false;
				break;
			}
		}
	}
	else if (RG8_SNORM == m_test_case)
	{
		static const GLuint n_channels = 4;

		Texture::Bind(gl, texture_id, GL_TEXTURE_2D);

		std::vector<GLubyte> pixels;
		pixels.resize(n_pixels * n_channels);
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			pixels[i * n_channels + 0] = (GLubyte)i;
			pixels[i * n_channels + 1] = (GLubyte)i;
		}

		Texture::GetData(gl, texture_id, 0 /* level */, width, height, GL_RGBA, GL_BYTE, &pixels[0]);

		/* Unbind */
		Texture::Bind(gl, 0, GL_TEXTURE_2D);

		/* Verify */
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			const GLbyte expected_red   = (GLubyte)(i % 16);
			const GLbyte expected_green = (GLubyte)(i / 16);
			const GLbyte drawn_red		= pixels[i * n_channels + 0];
			const GLbyte drawn_green	= pixels[i * n_channels + 1];

			if ((expected_red != drawn_red) || (expected_green != drawn_green))
			{
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message << "Invalid value: " << (GLint)drawn_red << ", " << (GLint)drawn_green
					<< ". Expected value: " << (GLint)expected_red << ", " << (GLint)expected_green
					<< ". At offset: " << i << tcu::TestLog::EndMessage;

				result = false;
				break;
			}
		}
	}
	else if (RGBA32F == m_test_case)
	{
		static const GLuint n_channels = 4;

		Texture::Bind(gl, texture_id, GL_TEXTURE_2D);

		std::vector<GLfloat> pixels;
		pixels.resize(n_pixels * n_channels);
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			pixels[i * n_channels + 0] = (GLfloat)i / (GLfloat)n_pixels;
			pixels[i * n_channels + 1] = (GLfloat)i / (GLfloat)n_pixels;
			pixels[i * n_channels + 2] = (GLfloat)i / (GLfloat)n_pixels;
			pixels[i * n_channels + 3] = (GLfloat)i / (GLfloat)n_pixels;
		}

		Texture::GetData(gl, texture_id, 0 /* level */, width, height, GL_RGBA, GL_FLOAT, &pixels[0]);

		/* Unbind */
		Texture::Bind(gl, 0, GL_TEXTURE_2D);

		/* Verify */
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			const GLfloat expected_red   = (GLfloat)(i % 16) / 16.0f;
			const GLfloat expected_green = (GLfloat)(i / 16) / 16.0f;
			const GLfloat expected_blue  = (GLfloat)i / 256.0f;
			const GLfloat expected_alpha = 1.0f;
			const GLfloat drawn_red		 = pixels[i * n_channels + 0];
			const GLfloat drawn_green	= pixels[i * n_channels + 1];
			const GLfloat drawn_blue	 = pixels[i * n_channels + 2];
			const GLfloat drawn_alpha	= pixels[i * n_channels + 3];

			if ((expected_red != drawn_red) || (expected_green != drawn_green) || (expected_blue != drawn_blue) ||
				(expected_alpha != drawn_alpha))
			{
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message << "Invalid value: " << drawn_red << ", " << drawn_green << ", "
					<< drawn_blue << ", " << drawn_alpha << ". Expected value: " << expected_red << ", "
					<< expected_green << ", " << expected_blue << ", " << expected_alpha << ". At offset: " << i
					<< tcu::TestLog::EndMessage;

				result = false;
				break;
			}
		}
	}
	else if (R32UI_MIPMAP == m_test_case)
	{
		static const GLuint n_channels = 4;

		Texture::Bind(gl, texture_id, GL_TEXTURE_2D);

		std::vector<GLuint> pixels;
		pixels.resize(n_pixels * n_channels);
		deMemset(&pixels[0], 0, n_pixels * n_channels * sizeof(GLuint));

		Texture::GetData(gl, texture_id, 1 /* level */, width, height, GL_RGBA_INTEGER, GL_UNSIGNED_INT, &pixels[0]);

		/* Unbind */
		Texture::Bind(gl, 0, GL_TEXTURE_2D);

		/* Verify */
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			const GLuint expected_red = i;
			const GLuint drawn_red	= pixels[i * n_channels];

			if (expected_red != drawn_red)
			{
				m_context.getTestContext().getLog() << tcu::TestLog::Message << "Invalid value: " << drawn_red
													<< ". Expected value: " << expected_red << " at offset: " << i
													<< tcu::TestLog::EndMessage;

				result = false;
				break;
			}
		}
	}
	else if (R32UI_MULTISAMPLE == m_test_case)
	{
		static const GLuint n_channels = 4;

		/* Compute Shader */
		static const GLchar* cs =
			"#version 320 es\n"
			"\n"
			"layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
			"\n"
			"layout (binding = 1, r32ui) writeonly uniform lowp uimage2D   uni_destination_image;\n"
			"layout (binding = 0, r32ui) readonly  uniform lowp uimage2DMS uni_source_image;\n"
			"\n"
			"void main()\n"
			"{\n"
			"    ivec2 point = ivec2(gl_WorkGroupID.x, gl_WorkGroupID.y);\n"
			"    uint  index = gl_WorkGroupID.y * 16U + gl_WorkGroupID.x;\n"
			"\n"
			"    uvec4 color_0 = imageLoad(uni_source_image, point, 0);\n"
			"    uvec4 color_1 = imageLoad(uni_source_image, point, 1);\n"
			"    uvec4 color_2 = imageLoad(uni_source_image, point, 2);\n"
			"    uvec4 color_3 = imageLoad(uni_source_image, point, 3);\n"
			"\n"
			"    if (any(equal(uvec4(color_0.r, color_1.r, color_2.r, color_3.r), uvec4(index + 3U))))\n"
			"    {\n"
			"        imageStore(uni_destination_image, point, uvec4(1U));\n"
			"    }\n"
			"    else\n"
			"    {\n"
			"        imageStore(uni_destination_image, point, uvec4(0U));\n"
			"    }\n"
			"}\n"
			"\n";

		Program program(m_context);
		Texture destination_texture(m_context);

		Texture::Generate(gl, destination_texture.m_id);
		Texture::Bind(gl, destination_texture.m_id, GL_TEXTURE_2D);
		Texture::Storage(gl, GL_TEXTURE_2D, 1, GL_R32UI, width, height, 0 /* depth */);

		program.Init(cs, "", "", "", "", "");
		program.Use();
		gl.bindImageTexture(0 /* unit */, texture_id, 0 /* level */, GL_FALSE /* layered */, 0 /* layer */,
							GL_READ_ONLY, GL_R32UI);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindImageTexture");
		gl.bindImageTexture(1 /* unit */, destination_texture.m_id, 0 /* level */, GL_FALSE /* layered */,
							0 /* layer */, GL_WRITE_ONLY, GL_R32UI);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindImageTexture");

		gl.dispatchCompute(16, 16, 1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "DispatchCompute");

		/* Pixels buffer initialization */
		std::vector<GLuint> pixels;
		pixels.resize(n_pixels * n_channels);
		for (GLuint i = 0; i < n_pixels * n_channels; ++i)
		{
			pixels[i] = i;
		}

		Texture::GetData(gl, destination_texture.m_id, 0 /* level */, width, height, GL_RGBA_INTEGER, GL_UNSIGNED_INT,
						 &pixels[0]);

		/* Unbind */
		Texture::Bind(gl, 0, GL_TEXTURE_2D);

		/* Verify */
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			const GLuint expected_red = 1;
			const GLuint drawn_red	= pixels[i * n_channels];

			if (expected_red != drawn_red)
			{
				m_context.getTestContext().getLog() << tcu::TestLog::Message << "Invalid value: " << drawn_red
													<< ". Expected value: " << expected_red << " at offset: " << i
													<< tcu::TestLog::EndMessage;

				result = false;
				break;
			}
		}
	}

	return result;
}